

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                    (QList<QPointer<QMdiSubWindow>_> *vector,QMdiSubWindow **u,qsizetype from)

{
  long lVar1;
  ulong uVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  long lVar4;
  qsizetype qVar5;
  QMdiSubWindow *pQVar6;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar2 = (vector->d).size;
  if ((ulong)from < uVar2) {
    pQVar3 = (vector->d).ptr;
    qVar5 = from * 0x10 + -0x10;
    do {
      lVar1 = uVar2 * -0x10 + qVar5;
      if (lVar1 == -0x10) goto LAB_0044f19c;
      lVar4 = *(long *)((long)&pQVar3[1].wp.d + qVar5);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
        pQVar6 = (QMdiSubWindow *)0x0;
      }
      else {
        pQVar6 = *(QMdiSubWindow **)((long)&pQVar3[1].wp.value + qVar5);
      }
      qVar5 = qVar5 + 0x10;
    } while (pQVar6 != *u);
    qVar5 = qVar5 >> 4;
LAB_0044f19c:
    if (lVar1 != -0x10) {
      return qVar5;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}